

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O3

bool __thiscall
MockQuicTransport::ReadHeader
          (MockQuicTransport *this,uint8_t *out_type,ssl_encryption_level_t *out_level,
          size_t *out_len)

{
  ushort uVar1;
  _Head_base<0UL,_bio_st_*,_false> _Var2;
  pointer pEVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  size_t __n;
  bool bVar8;
  uint8_t *buf_1;
  uint8_t *buf;
  uint8_t *data;
  pointer puVar9;
  void *__s2;
  size_t len;
  ulong uVar10;
  ulong uVar11;
  uint8_t level_id;
  uint32_t remaining_bytes;
  uint16_t cipher_suite;
  vector<unsigned_char,_std::allocator<unsigned_char>_> read_secret;
  uint8_t header [8];
  CBS cbs;
  allocator_type local_82;
  byte local_81;
  uint local_80;
  ushort local_7a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  uint8_t local_60 [8];
  ssl_encryption_level_t *local_58;
  ulong *local_50;
  uint8_t *local_48;
  CBS local_40;
  
  local_58 = out_level;
  local_50 = out_len;
  do {
    data = local_60;
    _Var2._M_head_impl =
         (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
    uVar10 = 8;
    do {
      uVar6 = 0x7fffffff;
      if (uVar10 < 0x7fffffff) {
        uVar6 = uVar10;
      }
      uVar4 = BIO_read((BIO *)_Var2._M_head_impl,data,(int)uVar6);
      if ((int)uVar4 < 1) {
        return false;
      }
      data = data + uVar4;
      uVar10 = uVar10 - uVar4;
    } while (uVar10 != 0);
    local_40.data = local_60;
    local_40.len = 8;
    iVar5 = CBS_get_u8(&local_40,out_type);
    if ((((iVar5 == 0) || (iVar5 = CBS_get_u8(&local_40,&local_81), iVar5 == 0)) ||
        (iVar5 = CBS_get_u16(&local_40,&local_7a), iVar5 == 0)) ||
       (iVar5 = CBS_get_u32(&local_40,&local_80), iVar5 == 0)) {
LAB_00126c2d:
      ReadHeader();
      return false;
    }
    pEVar3 = (this->read_levels_).
             super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->read_levels_).
                      super__Vector_base<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 5) <=
        (ulong)local_81) goto LAB_00126c2d;
    uVar10 = (ulong)local_81;
    uVar1 = pEVar3[uVar10].cipher;
    uVar4 = (uint)local_81;
    if ((local_81 == 0) || (uVar1 != 0)) {
      if (local_7a != uVar1) {
        if (local_81 < 4) {
          pcVar7 = *(char **)(&DAT_002d3020 + (ulong)local_81 * 8);
        }
        else {
          pcVar7 = "";
        }
        fprintf(_stderr,"Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",(ulong)local_7a,
                pcVar7,(ulong)uVar1);
        return false;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_78,
                 (long)*(pointer *)
                        ((long)&pEVar3[uVar10].secret.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl + 8) -
                 *(long *)&pEVar3[uVar10].secret.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data,&local_82);
      __s2 = pEVar3[uVar10].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)*(pointer *)
                     ((long)&pEVar3[uVar10].secret.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + 8) - (long)__s2;
      if (local_80 < uVar6) {
        ReadHeader((MockQuicTransport *)(ulong)uVar4);
        goto LAB_00126c86;
      }
      local_80 = local_80 - (int)uVar6;
      uVar11 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (uVar11 == 0) {
        __n = 0;
        goto LAB_00126be9;
      }
      _Var2._M_head_impl =
           (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
      puVar9 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      break;
    }
    if (uVar4 != 1) {
      ReadHeader((MockQuicTransport *)(ulong)uVar4);
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_78,(ulong)local_80,&local_82);
    uVar10 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_48 = out_type;
    if (uVar10 == 0) {
      bVar8 = false;
    }
    else {
      _Var2._M_head_impl =
           (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
      puVar9 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar6 = 0x7fffffff;
        if (uVar10 < 0x7fffffff) {
          uVar6 = uVar10;
        }
        uVar4 = BIO_read((BIO *)_Var2._M_head_impl,puVar9,(int)uVar6);
        bVar8 = (int)uVar4 < 1;
        if ((int)uVar4 < 1) break;
        puVar9 = puVar9 + uVar4;
        uVar10 = uVar10 - uVar4;
      } while (uVar10 != 0);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    out_type = local_48;
    if (bVar8) {
      return false;
    }
  } while( true );
LAB_00126b9f:
  uVar6 = 0x7fffffff;
  if (uVar11 < 0x7fffffff) {
    uVar6 = uVar11;
  }
  uVar4 = BIO_read((BIO *)_Var2._M_head_impl,puVar9,(int)uVar6);
  if ((int)uVar4 < 1) {
    ReadHeader();
    goto LAB_00126c86;
  }
  puVar9 = puVar9 + uVar4;
  uVar11 = uVar11 - uVar4;
  if (uVar11 == 0) {
    __s2 = pEVar3[uVar10].secret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    __n = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    uVar6 = (long)*(pointer *)
                   ((long)&pEVar3[uVar10].secret.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   + 8) - (long)__s2;
LAB_00126be9:
    if ((__n == uVar6) &&
       ((local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start ||
        (iVar5 = bcmp(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,__s2,__n), iVar5 == 0)))) {
      *local_58 = (uint)local_81;
      *local_50 = (ulong)local_80;
      bVar8 = true;
    }
    else {
      ReadHeader((MockQuicTransport *)(ulong)(uint)local_81);
LAB_00126c86:
      bVar8 = false;
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return bVar8;
  }
  goto LAB_00126b9f;
}

Assistant:

bool MockQuicTransport::ReadHeader(uint8_t *out_type,
                                   enum ssl_encryption_level_t *out_level,
                                   size_t *out_len) {
  for (;;) {
    uint8_t header[8];
    if (!ReadAll(bio_.get(), header)) {
      // TODO(davidben): Distinguish between errors and EOF. See
      // ReadApplicationData.
      return false;
    }

    CBS cbs;
    uint8_t level_id;
    uint16_t cipher_suite;
    uint32_t remaining_bytes;
    CBS_init(&cbs, header, sizeof(header));
    if (!CBS_get_u8(&cbs, out_type) ||
        !CBS_get_u8(&cbs, &level_id) ||
        !CBS_get_u16(&cbs, &cipher_suite) ||
        !CBS_get_u32(&cbs, &remaining_bytes) ||
        level_id >= read_levels_.size()) {
      fprintf(stderr, "Error parsing record header.\n");
      return false;
    }

    auto level = static_cast<ssl_encryption_level_t>(level_id);
    // Non-initial levels must be configured before use.
    uint16_t expect_cipher = read_levels_[level].cipher;
    if (expect_cipher == 0 && level != ssl_encryption_initial) {
      if (level == ssl_encryption_early_data) {
        // If we receive early data records without any early data keys, skip
        // the record. This means early data was rejected.
        std::vector<uint8_t> discard(remaining_bytes);
        if (!ReadAll(bio_.get(), bssl::Span(discard))) {
          return false;
        }
        continue;
      }
      fprintf(stderr,
              "Got record at level %s, but keys were not configured.\n",
              LevelToString(level));
      return false;
    }
    if (cipher_suite != expect_cipher) {
      fprintf(stderr, "Got cipher suite 0x%04x at level %s, wanted 0x%04x.\n",
              cipher_suite, LevelToString(level), expect_cipher);
      return false;
    }
    const std::vector<uint8_t> &secret = read_levels_[level].secret;
    std::vector<uint8_t> read_secret(secret.size());
    if (remaining_bytes < secret.size()) {
      fprintf(stderr, "Record at level %s too small.\n", LevelToString(level));
      return false;
    }
    remaining_bytes -= secret.size();
    if (!ReadAll(bio_.get(), bssl::Span(read_secret))) {
      fprintf(stderr, "Error reading record secret.\n");
      return false;
    }
    if (read_secret != secret) {
      fprintf(stderr, "Encryption secret at level %s did not match.\n",
              LevelToString(level));
      return false;
    }
    *out_level = level;
    *out_len = remaining_bytes;
    return true;
  }
}